

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::ConditionalExpr::ConditionalExpr
          (ConditionalExpr *this,shared_ptr<kratos::Var> *condition,shared_ptr<kratos::Var> *left,
          shared_ptr<kratos::Var> *right)

{
  initializer_list<const_kratos::IRNode_*> __l;
  int iVar1;
  element_type *peVar2;
  element_type *right_00;
  element_type *peVar3;
  VarException *this_00;
  allocator<const_kratos::IRNode_*> local_91;
  element_type *local_90;
  element_type **local_88;
  size_type local_80;
  vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> local_78;
  allocator<char> local_59;
  string local_58;
  __shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *local_28;
  shared_ptr<kratos::Var> *right_local;
  shared_ptr<kratos::Var> *left_local;
  shared_ptr<kratos::Var> *condition_local;
  ConditionalExpr *this_local;
  
  local_28 = &right->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>;
  right_local = left;
  left_local = condition;
  condition_local = (shared_ptr<kratos::Var> *)this;
  peVar2 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                     (&left->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  right_00 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get(local_28);
  Expr::Expr(&this->super_Expr,Conditional,peVar2,right_00);
  (this->super_Expr).super_Var.super_IRNode._vptr_IRNode = (_func_int **)&PTR_accept_005863a0;
  peVar2 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                     (&left_local->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
  this->condition = peVar2;
  peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      left_local);
  iVar1 = (*(peVar3->super_IRNode)._vptr_IRNode[7])();
  if (iVar1 != 1) {
    this_00 = (VarException *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,"Ternary operator\'s condition has to be a binary value",
               &local_59);
    local_90 = std::__shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>::get
                         (&left_local->super___shared_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2>);
    local_88 = &local_90;
    local_80 = 1;
    std::allocator<const_kratos::IRNode_*>::allocator(&local_91);
    __l._M_len = local_80;
    __l._M_array = (iterator)local_88;
    std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
              (&local_78,__l,&local_91);
    VarException::VarException(this_00,&local_58,&local_78);
    __cxa_throw(this_00,&VarException::typeinfo,VarException::~VarException);
  }
  return;
}

Assistant:

ConditionalExpr::ConditionalExpr(const std::shared_ptr<Var> &condition,
                                 const std::shared_ptr<Var> &left,
                                 const std::shared_ptr<Var> &right)
    : Expr(ExprOp::Conditional, left.get(), right.get()), condition(condition.get()) {
    if (condition->width() != 1)
        throw VarException("Ternary operator's condition has to be a binary value",
                           {condition.get()});
}